

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TgCreateGroups(Abc_TgMan_t *pMan)

{
  ulong *puVar1;
  uint nVars;
  word *pTruth;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  byte bVar7;
  int w;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong *puVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar25;
  long lVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar27;
  undefined1 auVar24 [16];
  int iVar28;
  int iVar30;
  int iVar31;
  undefined1 auVar29 [16];
  int iVar32;
  int pStore [17];
  int local_78 [18];
  
  nVars = pMan->nVars;
  lVar16 = (long)(int)nVars;
  bVar7 = (byte)nVars;
  uVar5 = 1 << (bVar7 - 6 & 0x1f);
  if (lVar16 < 7) {
    uVar5 = 1;
  }
  if (0x10 < lVar16) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x71a,"void Abc_TgCreateGroups(Abc_TgMan_t *)");
  }
  pTruth = pMan->pTruth;
  if ((int)nVars < 6) {
    lVar8 = 1L << (bVar7 & 0x3f);
    uVar13 = ~(-1L << ((byte)lVar8 & 0x3f)) & *pTruth;
    if (nVars < 6) {
      uVar9 = 0x40;
      if (0x40 < (ulong)(lVar8 * 2)) {
        uVar9 = lVar8 * 2;
      }
      uVar12 = (uVar9 - ((ulong)(nVars != 5) + lVar8 * 2) >> (bVar7 & 0x3f)) + (ulong)(nVars != 5);
      auVar29._8_4_ = (int)lVar8;
      auVar29._0_8_ = lVar8;
      auVar29._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar6 = auVar29._8_8_ * 2;
      auVar23._8_4_ = (int)lVar6;
      auVar23._0_8_ = lVar8;
      auVar23._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar13;
      auVar20._8_4_ = (int)uVar12;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      uVar9 = 0xfffffffffffffffe;
      do {
        auVar29 = auVar18;
        lVar26 = auVar23._8_8_;
        auVar3._8_4_ = (int)uVar13;
        auVar3._0_8_ = uVar13;
        auVar3._12_4_ = (int)(uVar13 >> 0x20);
        auVar19._8_8_ = auVar3._8_8_ << lVar26;
        auVar19._0_8_ = uVar13 << auVar23._0_8_;
        auVar18 = auVar19 | auVar29;
        auVar23._0_8_ = auVar23._0_8_ + lVar8 * 2;
        auVar23._8_8_ = lVar26 + lVar6;
        uVar9 = uVar9 + 2;
      } while ((uVar12 & 0xfffffffffffffffe) != uVar9);
      auVar22._8_4_ = (int)uVar9;
      auVar22._0_8_ = uVar9;
      auVar22._12_4_ = (int)(uVar9 >> 0x20);
      auVar20 = auVar20 ^ _DAT_0093d220;
      auVar23 = (auVar22 | _DAT_0093d210) ^ _DAT_0093d220;
      iVar28 = -(uint)(auVar20._0_4_ < auVar23._0_4_);
      iVar30 = -(uint)(auVar20._4_4_ < auVar23._4_4_);
      iVar31 = -(uint)(auVar20._8_4_ < auVar23._8_4_);
      iVar32 = -(uint)(auVar20._12_4_ < auVar23._12_4_);
      iVar25 = -(uint)(auVar23._4_4_ == auVar20._4_4_);
      iVar27 = -(uint)(auVar23._12_4_ == auVar20._12_4_);
      auVar21._4_4_ = iVar25;
      auVar21._0_4_ = iVar25;
      auVar21._8_4_ = iVar27;
      auVar21._12_4_ = iVar27;
      auVar4._4_4_ = iVar28;
      auVar4._0_4_ = iVar28;
      auVar4._8_4_ = iVar31;
      auVar4._12_4_ = iVar31;
      auVar24._4_4_ = iVar30;
      auVar24._0_4_ = iVar30;
      auVar24._8_4_ = iVar32;
      auVar24._12_4_ = iVar32;
      auVar24 = auVar24 | auVar21 & auVar4;
      auVar18 = ~auVar24 & auVar18 | auVar29 & auVar24;
      uVar13 = auVar18._8_8_ | auVar18._0_8_;
    }
    if (*pTruth != uVar13) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    iVar25 = 0;
    if (-1 < (int)uVar5) goto LAB_0050290c;
  }
  else {
    uVar9 = 0;
    iVar25 = 0;
    do {
      uVar12 = pTruth[uVar9];
      if (uVar12 != 0) {
        uVar12 = uVar12 - (uVar12 >> 1 & 0x5555555555555555);
        uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
        uVar12 = (uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f;
        uVar12 = (uVar12 >> 8) + uVar12;
        lVar8 = (uVar12 >> 0x10) + uVar12;
        iVar25 = iVar25 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
      }
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
    if (iVar25 == uVar5 * 0x20 || SBORROW4(iVar25,uVar5 * 0x20) != (int)(iVar25 + uVar5 * -0x20) < 0
       ) goto LAB_0050290c;
    uVar9 = 0;
    do {
      pTruth[uVar9] = ~pTruth[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar13 != uVar9);
  }
  iVar25 = uVar5 * 0x40 - iVar25;
  pMan->uPhase = pMan->uPhase | 1 << (bVar7 & 0x1f);
LAB_0050290c:
  Abc_TtCountOnesInCofs(pTruth,nVars,local_78);
  local_78[lVar16] = iVar25;
  if (0 < (int)nVars) {
    uVar9 = 0;
    do {
      iVar27 = iVar25 - local_78[uVar9];
      if (local_78[uVar9] < iVar27) {
        puVar14 = pMan->pTruth;
        bVar7 = (byte)uVar9;
        if (uVar5 == 1) {
          bVar10 = (byte)(1 << (bVar7 & 0x1f));
          *puVar14 = (s_Truths6[uVar9] & *puVar14) >> (bVar10 & 0x3f) |
                     *puVar14 << (bVar10 & 0x3f) & s_Truths6[uVar9];
        }
        else if (uVar9 < 6) {
          if (0 < (int)uVar5) {
            uVar12 = s_Truths6[uVar9];
            uVar15 = 0;
            do {
              bVar10 = (byte)(1 << (bVar7 & 0x1f));
              puVar14[uVar15] =
                   (puVar14[uVar15] & uVar12) >> (bVar10 & 0x3f) |
                   puVar14[uVar15] << (bVar10 & 0x3f) & uVar12;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
        }
        else if (0 < (int)uVar5) {
          puVar1 = puVar14 + (int)uVar5;
          bVar10 = (byte)(uVar9 - 6);
          uVar11 = 1 << (bVar10 & 0x1f);
          iVar28 = 2 << (bVar10 & 0x1f);
          uVar12 = 1;
          if (1 < (int)uVar11) {
            uVar12 = (ulong)uVar11;
          }
          puVar17 = puVar14 + (int)uVar11;
          do {
            if (uVar9 - 6 != 0x1f) {
              uVar15 = 0;
              do {
                uVar2 = puVar14[uVar15];
                puVar14[uVar15] = puVar17[uVar15];
                puVar17[uVar15] = uVar2;
                uVar15 = uVar15 + 1;
              } while (uVar12 != uVar15);
            }
            puVar14 = puVar14 + iVar28;
            puVar17 = puVar17 + iVar28;
          } while (puVar14 < puVar1);
        }
        pMan->uPhase = pMan->uPhase | 1 << (bVar7 & 0x1f);
        local_78[uVar9] = iVar27;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != nVars);
  }
  Abc_TgSplitGroup(pMan,pMan->pGroup,local_78);
  pMan->fPhased = (uint)(local_78[0] * 2 != iVar25);
  return;
}

Assistant:

static void Abc_TgCreateGroups(Abc_TgMan_t * pMan)
{
    int pStore[17];
    int i, nOnes;
    int nVars = pMan->nVars, nWords = Abc_TtWordNum(nVars);
    //TiedGroup * pGrp = pMan->pGroup;
    assert(nVars <= 16);
    // normalize polarity    
    nOnes = Abc_TtCountOnesInTruth(pMan->pTruth, nVars);
    if (nOnes > nWords * 32)
    {
        Abc_TtNot(pMan->pTruth, nWords);
        nOnes = nWords * 64 - nOnes;
        pMan->uPhase |= (1 << nVars);
    }
    // normalize phase
    Abc_TtCountOnesInCofs(pMan->pTruth, nVars, pStore);
    pStore[nVars] = nOnes;
    for (i = 0; i < nVars; i++)
    {
        if (pStore[i] >= nOnes - pStore[i])
            continue;
        Abc_TtFlip(pMan->pTruth, nWords, i);
        pMan->uPhase |= (1 << i);
        pStore[i] = nOnes - pStore[i];
    }

    Abc_TgSplitGroup(pMan, pMan->pGroup, pStore);
    pMan->fPhased = pStore[0] * 2 != nOnes;
}